

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_heart_Parser.h
# Opt level: O1

bool __thiscall
soul::heart::Parser::parseWriteStream
          (Parser *this,FunctionParseState *state,FunctionBuilder *builder)

{
  SourceCodeText *o;
  Module *pMVar1;
  pointer ppVar2;
  pointer pcVar3;
  size_type sVar4;
  FunctionBuilder *pFVar5;
  bool bVar6;
  Expression *pEVar7;
  Expression *args_3;
  WriteStream *pWVar8;
  int line;
  char *pcVar9;
  char *message;
  Identifier *in_R9;
  pool_ref<soul::heart::OutputDeclaration> *f;
  pointer ppVar10;
  OutputDeclaration *args_1;
  bool bVar11;
  string_view other;
  Identifier name;
  CodeLocation local_98;
  FunctionBuilder *local_88;
  char *local_80;
  string *local_78;
  CompileMessage local_70;
  pool_ptr<soul::heart::Expression> local_38;
  
  o = (this->
      super_Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
      ).location.sourceCode.object;
  if (o != (SourceCodeText *)0x0) {
    (o->super_RefCountedObject).refCount = (o->super_RefCountedObject).refCount + 1;
  }
  pcVar9 = (this->
           super_Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
           ).location.location.data;
  local_78 = (string *)parseGeneralIdentifier(this);
  pMVar1 = (this->module).object;
  if (pMVar1 == (Module *)0x0) {
    line = 0x3c;
    pcVar9 = "operator->";
    message = "object != nullptr";
  }
  else {
    local_88 = builder;
    local_80 = pcVar9;
    if (local_78 != (string *)0x0) {
      ppVar10 = (pMVar1->outputs).
                super__Vector_base<soul::pool_ref<soul::heart::OutputDeclaration>,_std::allocator<soul::pool_ref<soul::heart::OutputDeclaration>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      ppVar2 = (pMVar1->outputs).
               super__Vector_base<soul::pool_ref<soul::heart::OutputDeclaration>,_std::allocator<soul::pool_ref<soul::heart::OutputDeclaration>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      bVar11 = ppVar10 == ppVar2;
      if (!bVar11) {
        pcVar3 = (local_78->_M_dataplus)._M_p;
        sVar4 = local_78->_M_string_length;
        do {
          other._M_str = pcVar3;
          other._M_len = sVar4;
          bVar6 = Identifier::operator==(&(ppVar10->object->super_IODeclaration).name,other);
          if (bVar6) {
            if (!bVar11) {
              args_1 = ppVar10->object;
              goto LAB_00257794;
            }
            break;
          }
          ppVar10 = ppVar10 + 1;
          bVar11 = ppVar10 == ppVar2;
        } while (!bVar11);
      }
      args_1 = (OutputDeclaration *)0x0;
LAB_00257794:
      if (args_1 == (OutputDeclaration *)0x0) {
        CompileMessageHelpers::createMessage<soul::Identifier&>
                  (&local_70,(CompileMessageHelpers *)0x1,none,0x2ac54c,(char *)&local_78,in_R9);
        (*(this->
          super_Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
          )._vptr_Tokeniser[2])(this,&local_70);
        RefCountedPtr<soul::SourceCodeText>::decIfNotNull(local_70.location.sourceCode.object);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_70.description._M_dataplus._M_p != &local_70.description.field_2) {
          operator_delete(local_70.description._M_dataplus._M_p,
                          (ulong)(local_70.description.field_2._M_allocated_capacity + 1));
        }
      }
      bVar11 = Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
               ::matchIf<soul::TokenType>
                         (&this->
                           super_Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
                          ,(TokenType)0x2b016a);
      if (bVar11) {
        local_70.description._M_dataplus._M_p = (pointer)0x700000001;
        local_70.description._M_string_length = 0;
        local_70.description.field_2._M_allocated_capacity = 0;
        pEVar7 = parseExpression(this,state,(Type *)&local_70);
        RefCountedPtr<soul::Structure>::decIfNotNull
                  ((Structure *)local_70.description.field_2._M_allocated_capacity);
        Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
        ::expect<soul::TokenType>
                  (&this->
                    super_Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
                   ,(TokenType)0x285ffb);
      }
      else {
        pEVar7 = (Expression *)0x0;
      }
      args_3 = parseExpression(this,state);
      pFVar5 = local_88;
      if (o != (SourceCodeText *)0x0) {
        (o->super_RefCountedObject).refCount = (o->super_RefCountedObject).refCount + 1;
      }
      local_98.location.data = local_80;
      local_98.sourceCode.object = o;
      if (args_1 == (OutputDeclaration *)0x0) {
        throwInternalCompilerError("object != nullptr","operator*",0x3b);
      }
      local_38.object = pEVar7;
      pWVar8 = PoolAllocator::
               allocate<soul::heart::WriteStream,soul::CodeLocation,soul::heart::OutputDeclaration&,soul::pool_ptr<soul::heart::Expression>&,soul::heart::Expression&>
                         (&((local_88->super_BlockBuilder).module)->allocator->pool,&local_98,args_1
                          ,&local_38,args_3);
      (*(pFVar5->super_BlockBuilder)._vptr_BlockBuilder[2])(pFVar5,pWVar8);
      RefCountedPtr<soul::SourceCodeText>::decIfNotNull(local_98.sourceCode.object);
      Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>::
      expect<soul::TokenType>
                (&this->
                  super_Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
                 ,(TokenType)0x2881d4);
      RefCountedPtr<soul::SourceCodeText>::decIfNotNull(o);
      return true;
    }
    line = 0x22;
    pcVar9 = "operator basic_string_view";
    message = "isValid()";
  }
  throwInternalCompilerError(message,pcVar9,line);
}

Assistant:

bool parseWriteStream (FunctionParseState& state, FunctionBuilder& builder)
    {
        auto writeStreamLocation = location;
        auto name = parseGeneralIdentifier();
        auto target = module->findOutput (name);

        pool_ptr<heart::Expression> index;

        if (target == nullptr)
            throwError (Errors::cannotFindOutput (name));

        if (matchIf (HEARTOperator::openBracket))
        {
            index = parseExpression (state, PrimitiveType::int32);
            expect (HEARTOperator::closeBracket);
        }

        auto& value = parseExpression (state);

        builder.addWriteStream (writeStreamLocation, *target, index, value);
        expectSemicolon();
        return true;
    }